

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlRegFreeParserCtxt(xmlRegParserCtxtPtr ctxt)

{
  long lVar1;
  
  if (ctxt->string != (xmlChar *)0x0) {
    (*xmlFree)(ctxt->string);
  }
  if (ctxt->states != (xmlRegStatePtr *)0x0) {
    if (0 < ctxt->nbStates) {
      lVar1 = 0;
      do {
        xmlRegFreeState(ctxt->states[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < ctxt->nbStates);
    }
    (*xmlFree)(ctxt->states);
  }
  if (ctxt->atoms != (xmlRegAtomPtr *)0x0) {
    if (0 < ctxt->nbAtoms) {
      lVar1 = 0;
      do {
        xmlRegFreeAtom(ctxt->atoms[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < ctxt->nbAtoms);
    }
    (*xmlFree)(ctxt->atoms);
  }
  if (ctxt->counters != (xmlRegCounter *)0x0) {
    (*xmlFree)(ctxt->counters);
  }
  (*xmlFree)(ctxt);
  return;
}

Assistant:

static void
xmlRegFreeParserCtxt(xmlRegParserCtxtPtr ctxt) {
    int i;
    if (ctxt == NULL)
	return;

    if (ctxt->string != NULL)
	xmlFree(ctxt->string);
    if (ctxt->states != NULL) {
	for (i = 0;i < ctxt->nbStates;i++)
	    xmlRegFreeState(ctxt->states[i]);
	xmlFree(ctxt->states);
    }
    if (ctxt->atoms != NULL) {
	for (i = 0;i < ctxt->nbAtoms;i++)
	    xmlRegFreeAtom(ctxt->atoms[i]);
	xmlFree(ctxt->atoms);
    }
    if (ctxt->counters != NULL)
	xmlFree(ctxt->counters);
    xmlFree(ctxt);
}